

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.hpp
# Opt level: O0

void unodb::detail::deallocation_request::assert_zero_instances(void)

{
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  if (instance_count != 0) {
    __assert_fail("instance_count.load(std::memory_order_relaxed) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x205,"static void unodb::detail::deallocation_request::assert_zero_instances()")
    ;
  }
  return;
}

Assistant:

static void assert_zero_instances() noexcept {
    UNODB_DETAIL_ASSERT(instance_count.load(std::memory_order_relaxed) == 0);
  }